

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shake.cpp
# Opt level: O2

int __thiscall OpenMD::Shake::constraintPairF(Shake *this,ConstraintPair *consPair)

{
  ConstraintElem *this_00;
  ConstraintElem *this_01;
  double dVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  double s;
  double dVar5;
  Vector<double,_3U> local_108;
  Vector3d frcA;
  Vector3d frcB;
  Vector3d rab;
  Vector<double,_3U> local_a8;
  Vector<double,_3U> local_90;
  Vector3d fpab;
  Vector3d posB;
  Vector3d posA;
  
  this_00 = consPair->consElem1_;
  this_01 = consPair->consElem2_;
  ConstraintElem::getPos((Vector3d *)&posA.super_Vector<double,_3U>,this_00);
  ConstraintElem::getPos((Vector3d *)&posB.super_Vector<double,_3U>,this_01);
  operator-(&frcA.super_Vector<double,_3U>,&posA.super_Vector<double,_3U>,
            &posB.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&rab.super_Vector<double,_3U>,&frcA.super_Vector<double,_3U>);
  Snapshot::wrapVector(this->currentSnapshot_,(Vector3d *)&rab.super_Vector<double,_3U>);
  ConstraintElem::getFrc((Vector3d *)&frcA.super_Vector<double,_3U>,this_00);
  ConstraintElem::getFrc((Vector3d *)&frcB.super_Vector<double,_3U>,this_01);
  dVar1 = 1.0 / this_00->sd_->mass_;
  s = 1.0 / this_01->sd_->mass_;
  operator*(&local_90,&frcA.super_Vector<double,_3U>,dVar1);
  operator*(&local_a8,&frcB.super_Vector<double,_3U>,s);
  operator-(&local_108,&local_90,&local_a8);
  Vector<double,_3U>::Vector(&fpab.super_Vector<double,_3U>,&local_108);
  dVar2 = Vector<double,_3U>::lengthSquare(&fpab.super_Vector<double,_3U>);
  dVar5 = 1.0;
  if (1.0 <= dVar2) {
    dVar5 = dVar2;
  }
  dVar2 = Vector<double,_3U>::lengthSquare(&rab.super_Vector<double,_3U>);
  dVar3 = dot<double,3u>(&rab.super_Vector<double,_3U>,&fpab.super_Vector<double,_3U>);
  dVar5 = dVar5 * dVar2;
  if (dVar5 < 0.0) {
    dVar5 = sqrt(dVar5);
  }
  else {
    dVar5 = SQRT(dVar5);
  }
  bVar4 = ABS(dVar3) <= dVar5 * this->consTolerance_;
  if (!bVar4) {
    dVar1 = -dVar3 / ((dVar1 + s) * dVar2);
    operator*(&local_108,&rab.super_Vector<double,_3U>,dVar1);
    Vector<double,_3U>::add(&frcA.super_Vector<double,_3U>,&local_108);
    operator*(&local_108,&rab.super_Vector<double,_3U>,dVar1);
    Vector<double,_3U>::sub(&frcB.super_Vector<double,_3U>,&local_108);
    ConstraintElem::setFrc(this_00,(Vector3d *)&frcA.super_Vector<double,_3U>);
    ConstraintElem::setFrc(this_01,(Vector3d *)&frcB.super_Vector<double,_3U>);
    consPair->force_ = dVar1;
  }
  return (uint)bVar4;
}

Assistant:

int Shake::constraintPairF(ConstraintPair* consPair) {
    ConstraintElem* consElem1 = consPair->getConsElem1();
    ConstraintElem* consElem2 = consPair->getConsElem2();

    Vector3d posA = consElem1->getPos();
    Vector3d posB = consElem2->getPos();

    Vector3d rab = posA - posB;

    currentSnapshot_->wrapVector(rab);

    Vector3d frcA = consElem1->getFrc();
    Vector3d frcB = consElem2->getFrc();

    RealType rma = 1.0 / consElem1->getMass();
    RealType rmb = 1.0 / consElem2->getMass();

    Vector3d fpab = frcA * rma - frcB * rmb;

    RealType gab = fpab.lengthSquare();
    if (gab < 1.0) gab = 1.0;

    RealType rabsq = rab.lengthSquare();
    RealType rfab  = dot(rab, fpab);

    if (fabs(rfab) > sqrt(rabsq * gab) * consTolerance_) {
      gab = -rfab / (rabsq * (rma + rmb));

      frcA += rab * gab;
      frcB -= rab * gab;

      consElem1->setFrc(frcA);
      consElem2->setFrc(frcB);

      // report the constraint force back to the constraint pair:
      consPair->setConstraintForce(gab);
      return consSuccess;
    } else
      return consAlready;
  }